

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2AppendChild(xmlParserCtxtPtr ctxt,xmlNodePtr node)

{
  _xmlNode *p_Var1;
  xmlNodePtr last;
  xmlNodePtr parent;
  xmlNodePtr node_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->inSubset == 1) {
    last = (xmlNodePtr)ctxt->myDoc->intSubset;
  }
  else if (ctxt->inSubset == 2) {
    last = (xmlNodePtr)ctxt->myDoc->extSubset;
  }
  else {
    last = ctxt->node;
    if (last == (xmlNodePtr)0x0) {
      last = (xmlNodePtr)ctxt->myDoc;
    }
  }
  p_Var1 = last->last;
  if (p_Var1 == (_xmlNode *)0x0) {
    last->children = node;
  }
  else {
    p_Var1->next = node;
    node->prev = p_Var1;
  }
  last->last = node;
  node->parent = last;
  if (((node->type != XML_TEXT_NODE) && (ctxt->linenumbers != 0)) &&
     (ctxt->input != (xmlParserInputPtr)0x0)) {
    if ((uint)ctxt->input->line < 0xffff) {
      node->line = (unsigned_short)ctxt->input->line;
    }
    else {
      node->line = 0xffff;
    }
  }
  return;
}

Assistant:

static void
xmlSAX2AppendChild(xmlParserCtxtPtr ctxt, xmlNodePtr node) {
    xmlNodePtr parent;
    xmlNodePtr last;

    if (ctxt->inSubset == 1) {
	parent = (xmlNodePtr) ctxt->myDoc->intSubset;
    } else if (ctxt->inSubset == 2) {
	parent = (xmlNodePtr) ctxt->myDoc->extSubset;
    } else {
        parent = ctxt->node;
        if (parent == NULL)
            parent = (xmlNodePtr) ctxt->myDoc;
    }

    last = parent->last;
    if (last == NULL) {
        parent->children = node;
    } else {
        last->next = node;
        node->prev = last;
    }

    parent->last = node;
    node->parent = parent;

    if ((node->type != XML_TEXT_NODE) &&
        (ctxt->linenumbers) &&
	(ctxt->input != NULL)) {
        if ((unsigned) ctxt->input->line < (unsigned) USHRT_MAX)
            node->line = ctxt->input->line;
        else
            node->line = USHRT_MAX;
    }
}